

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_primitives.cpp
# Opt level: O3

string * __thiscall
editor::figures::Polygon::get_representation_abi_cxx11_
          (string *__return_storage_ptr__,Polygon *this)

{
  pointer pCVar1;
  ostream *poVar2;
  Coordinate *point;
  pointer pCVar3;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"polygon: ",9);
  pCVar1 = (this->points).
           super__Vector_base<editor::Coordinate,_std::allocator<editor::Coordinate>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->points).
                super__Vector_base<editor::Coordinate,_std::allocator<editor::Coordinate>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(",1);
    poVar2 = (ostream *)std::ostream::operator<<(local_1a8,pCVar3->x);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,pCVar3->y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string Polygon::get_representation() {
        std::stringstream ss;
        ss << "polygon: ";
        for (const auto& point: points)
            ss << "(" << point.x << "," << point.y << ") ";
        return ss.str();
    }